

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReader.h
# Opt level: O0

ssize_t __thiscall FileReader::write(FileReader *this,int __fd,void *__buf,size_t __n)

{
  posixerror *this_00;
  undefined4 in_register_00000034;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  size_t local_28;
  size_t r;
  size_t n_local;
  uint8_t *p_local;
  FileReader *this_local;
  
  n_local = CONCAT44(in_register_00000034,__fd);
  r = (size_t)__buf;
  p_local = (uint8_t *)this;
  if (this->_state == STATE_READING) {
    flush(this);
  }
  this->_state = STATE_WRITING;
  local_28 = fwrite((void *)n_local,1,r,(FILE *)this->_f);
  if (local_28 < r) {
    this_00 = (posixerror *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"writing ",&local_69);
    std::operator+(&local_48,&local_68,&this->_filename);
    posixerror::posixerror(this_00,&local_48);
    __cxa_throw(this_00,&posixerror::typeinfo,posixerror::~posixerror);
  }
  return local_28;
}

Assistant:

virtual void write(const uint8_t *p, size_t n)
    {
        if (_state==STATE_READING)
            flush();
        _state= STATE_WRITING;
        //printf("writing %p  [%p, %x]\n", _f, p, n);
        size_t r= fwrite(p, 1, n, _f);
        if (r<n)
            throw posixerror(std::string("writing ")+_filename);
    }